

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

size_t get_quoted_len(char *str,wchar_t qu)

{
  wchar_t wVar1;
  size_t sVar2;
  
  sVar2 = strlen(str);
  while( true ) {
    wVar1 = utf8_ptr::s_getch(str);
    if (wVar1 == L'\0') break;
    wVar1 = utf8_ptr::s_getch(str);
    sVar2 = sVar2 + (wVar1 == L'\\' || wVar1 == qu);
    str = utf8_ptr::s_inc(str);
  }
  return sVar2;
}

Assistant:

static size_t get_quoted_len(const char *str, wchar_t qu)
{
    utf8_ptr p;
    size_t len;

    /* 
     *   scan the string for instances of the quote mark; each one adds an
     *   extra byte to the length needed, since each one requires a
     *   backslash character to escape the quote mark 
     */
    for (p.set((char *)str), len = strlen(str) ; p.getch() != '\0' ; p.inc())
    {
        wchar_t ch;
        
        /* 
         *   check to see if this character is quotable - it is quotable if
         *   it's a backslash or it's the quote character we're escaping 
         */
        ch = p.getch();
        if (ch == qu || ch == '\\')
        {
            /* 
             *   we need to escape this character, so add a byte for the
             *   backslash we'll need to insert 
             */
            ++len;
        }
    }

    /* return the length we calculated */
    return len;
}